

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLsPSolve(void *arkode_mem,N_Vector r,N_Vector z,realtype tol,int lr)

{
  int error_code;
  realtype gamma;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  int dgamma_fail;
  int *jcur;
  realtype gamrat;
  realtype local_60;
  ARKLsMem local_58;
  ARKodeMem local_50;
  int local_44;
  int *local_40;
  realtype local_38;
  
  error_code = arkLs_AccessLMem(arkode_mem,"arkLsPSolve",&local_50,&local_58);
  if (error_code == 0) {
    error_code = (*local_50->step_getgammas)(arkode_mem,&local_60,&local_38,&local_40,&local_44);
    if (error_code == 0) {
      error_code = (*local_58->psolve)(local_58->tcur,local_58->ycur,local_58->fcur,r,z,local_60,tol
                                       ,lr,local_58->P_data);
      local_58->nps = local_58->nps + 1;
    }
    else {
      arkProcessError(local_50,error_code,"ARKLS","arkLsPSolve",
                      "An error occurred in ark_step_getgammas");
    }
  }
  return error_code;
}

Assistant:

int arkLsPSolve(void *arkode_mem, N_Vector r, N_Vector z,
                realtype tol, int lr)
{
  ARKodeMem   ark_mem;
  ARKLsMem    arkls_mem;
  realtype    gamma, gamrat;
  booleantype dgamma_fail, *jcur;
  int         retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLsPSolve",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* get gamma values from time step module */
  retval = ark_mem->step_getgammas(arkode_mem, &gamma, &gamrat,
                                   &jcur, &dgamma_fail);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKLS", "arkLsPSolve",
                    "An error occurred in ark_step_getgammas");
    return(retval);
  }

  /* call the user-supplied psolve routine, and accumulate count */
  retval = arkls_mem->psolve(arkls_mem->tcur,
                             arkls_mem->ycur,
                             arkls_mem->fcur, r, z,
                             gamma, tol, lr,
                             arkls_mem->P_data);
  arkls_mem->nps++;
  return(retval);
}